

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_column.h
# Opt level: O1

bool Gudhi::persistence_matrix::operator<
               (Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
                *c1,Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
                    *c2)

{
  uint uVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  _Hash_node_base *p_Var6;
  __node_base_ptr p_Var7;
  __hash_code __code;
  ulong uVar8;
  ulong uVar9;
  __node_base_ptr p_Var10;
  pointer ppEVar11;
  pointer ppEVar12;
  bool bVar13;
  
  if (c1 == c2) {
    bVar13 = false;
  }
  else {
    ppEVar12 = (c1->column_).
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppEVar2 = (c1->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppEVar11 = (c2->column_).
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppEVar12 != ppEVar2) {
      ppEVar3 = (c2->column_).
                super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar4 = (c1->erasedValues_)._M_h._M_bucket_count;
      uVar9 = (c2->erasedValues_)._M_h._M_bucket_count;
LAB_0017a8d9:
      if (ppEVar11 != ppEVar3) {
        for (; ppEVar12 != ppEVar2; ppEVar12 = ppEVar12 + 1) {
          uVar1 = (*ppEVar12)->rowIndex_;
          uVar8 = (ulong)uVar1 % uVar4;
          p_Var5 = (c1->erasedValues_)._M_h._M_buckets[uVar8];
          p_Var7 = (__node_base_ptr)0x0;
          if ((p_Var5 != (__node_base_ptr)0x0) &&
             (p_Var7 = p_Var5, p_Var10 = p_Var5->_M_nxt, uVar1 != *(uint *)&p_Var5->_M_nxt[1]._M_nxt
             )) {
            while (p_Var6 = p_Var10->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
              p_Var7 = (__node_base_ptr)0x0;
              if (((ulong)*(uint *)&p_Var6[1]._M_nxt % uVar4 != uVar8) ||
                 (p_Var7 = p_Var10, p_Var10 = p_Var6, uVar1 == *(uint *)&p_Var6[1]._M_nxt))
              goto LAB_0017a93f;
            }
            p_Var7 = (__node_base_ptr)0x0;
          }
LAB_0017a93f:
          if ((p_Var7 == (__node_base_ptr)0x0) || (p_Var7->_M_nxt == (_Hash_node_base *)0x0)) break;
        }
        do {
          if (ppEVar11 == ppEVar3) goto LAB_0017a9bc;
          uVar1 = (*ppEVar11)->rowIndex_;
          uVar8 = (ulong)uVar1 % uVar9;
          p_Var5 = (c2->erasedValues_)._M_h._M_buckets[uVar8];
          p_Var7 = (__node_base_ptr)0x0;
          if ((p_Var5 != (__node_base_ptr)0x0) &&
             (p_Var7 = p_Var5, p_Var10 = p_Var5->_M_nxt, uVar1 != *(uint *)&p_Var5->_M_nxt[1]._M_nxt
             )) {
            while (p_Var6 = p_Var10->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
              p_Var7 = (__node_base_ptr)0x0;
              if (((ulong)*(uint *)&p_Var6[1]._M_nxt % uVar9 != uVar8) ||
                 (p_Var7 = p_Var10, p_Var10 = p_Var6, uVar1 == *(uint *)&p_Var6[1]._M_nxt))
              goto LAB_0017a9b1;
            }
            p_Var7 = (__node_base_ptr)0x0;
          }
LAB_0017a9b1:
          if ((p_Var7 == (__node_base_ptr)0x0) || (p_Var7->_M_nxt == (_Hash_node_base *)0x0))
          goto LAB_0017a9bc;
          ppEVar11 = ppEVar11 + 1;
        } while( true );
      }
    }
LAB_0017a9e9:
    ppEVar12 = (c2->column_).
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    bVar13 = ppEVar11 != ppEVar12;
    if (bVar13) {
      uVar4 = (c2->erasedValues_)._M_h._M_bucket_count;
      do {
        uVar1 = (*ppEVar11)->rowIndex_;
        uVar9 = (ulong)uVar1 % uVar4;
        p_Var5 = (c2->erasedValues_)._M_h._M_buckets[uVar9];
        p_Var7 = (__node_base_ptr)0x0;
        if ((p_Var5 != (__node_base_ptr)0x0) &&
           (p_Var7 = p_Var5, p_Var10 = p_Var5->_M_nxt, uVar1 != *(uint *)&p_Var5->_M_nxt[1]._M_nxt))
        {
          while (p_Var6 = p_Var10->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
            p_Var7 = (__node_base_ptr)0x0;
            if (((ulong)*(uint *)&p_Var6[1]._M_nxt % uVar4 != uVar9) ||
               (p_Var7 = p_Var10, p_Var10 = p_Var6, uVar1 == *(uint *)&p_Var6[1]._M_nxt))
            goto LAB_0017aa5e;
          }
          p_Var7 = (__node_base_ptr)0x0;
        }
LAB_0017aa5e:
        if (p_Var7 == (__node_base_ptr)0x0) {
          return bVar13;
        }
        if (p_Var7->_M_nxt == (_Hash_node_base *)0x0) {
          return bVar13;
        }
        ppEVar11 = ppEVar11 + 1;
        bVar13 = ppEVar11 != ppEVar12;
      } while (bVar13);
    }
  }
  return bVar13;
LAB_0017a9bc:
  if ((ppEVar12 == ppEVar2) || (ppEVar11 == ppEVar3)) goto LAB_0017a9e9;
  if ((*ppEVar12)->rowIndex_ != (*ppEVar11)->rowIndex_) {
    return (*ppEVar12)->rowIndex_ < (*ppEVar11)->rowIndex_;
  }
  ppEVar12 = ppEVar12 + 1;
  ppEVar11 = ppEVar11 + 1;
  if (ppEVar12 == ppEVar2) goto LAB_0017a9e9;
  goto LAB_0017a8d9;
}

Assistant:

bool operator<(const Vector_column& c1, const Vector_column& c2) {
    if (&c1 == &c2) return false;

    auto it1 = c1.column_.begin();
    auto it2 = c2.column_.begin();
    while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
      if constexpr (!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type) {
        while (it1 != c1.column_.end() && c1.erasedValues_.find((*it1)->get_row_index()) != c1.erasedValues_.end())
          ++it1;
        while (it2 != c2.column_.end() && c2.erasedValues_.find((*it2)->get_row_index()) != c2.erasedValues_.end())
          ++it2;
        if (it1 == c1.column_.end() || it2 == c2.column_.end()) break;
      }

      if ((*it1)->get_row_index() != (*it2)->get_row_index()) return (*it1)->get_row_index() < (*it2)->get_row_index();
      if constexpr (!Master_matrix::Option_list::is_z2) {
        if ((*it1)->get_element() != (*it2)->get_element()) return (*it1)->get_element() < (*it2)->get_element();
      }
      ++it1;
      ++it2;
    }
    if constexpr (!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type) {
      while (it1 != c1.column_.end() && c1.erasedValues_.find((*it1)->get_row_index()) != c1.erasedValues_.end()) ++it1;
      while (it2 != c2.column_.end() && c2.erasedValues_.find((*it2)->get_row_index()) != c2.erasedValues_.end()) ++it2;
    }
    return it2 != c2.column_.end();
  }